

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_function_catalog_entry.cpp
# Opt level: O2

void __thiscall
duckdb::PragmaFunctionCatalogEntry::PragmaFunctionCatalogEntry
          (PragmaFunctionCatalogEntry *this,Catalog *catalog,SchemaCatalogEntry *schema,
          CreatePragmaFunctionInfo *info)

{
  FunctionEntry::FunctionEntry
            (&this->super_FunctionEntry,PRAGMA_FUNCTION_ENTRY,catalog,schema,
             &info->super_CreateFunctionInfo);
  (this->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.
  _vptr_CatalogEntry = (_func_int **)&PTR__PragmaFunctionCatalogEntry_027ac790;
  FunctionSet<duckdb::PragmaFunction>::FunctionSet
            (&(this->functions).super_FunctionSet<duckdb::PragmaFunction>,
             &(info->functions).super_FunctionSet<duckdb::PragmaFunction>);
  return;
}

Assistant:

PragmaFunctionCatalogEntry::PragmaFunctionCatalogEntry(Catalog &catalog, SchemaCatalogEntry &schema,
                                                       CreatePragmaFunctionInfo &info)
    : FunctionEntry(CatalogType::PRAGMA_FUNCTION_ENTRY, catalog, schema, info), functions(std::move(info.functions)) {
}